

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlCmpTextWriterStackEntry(void *data0,void *data1)

{
  int iVar1;
  
  if (data0 == data1) {
    return 0;
  }
  if (data0 != (void *)0x0) {
    if (data1 != (void *)0x0) {
      iVar1 = xmlStrcmp(*data0,*data1);
      return iVar1;
    }
    return 1;
  }
  return -1;
}

Assistant:

static int
xmlCmpTextWriterStackEntry(const void *data0, const void *data1)
{
    xmlTextWriterStackEntry *p0;
    xmlTextWriterStackEntry *p1;

    if (data0 == data1)
        return 0;

    if (data0 == 0)
        return -1;

    if (data1 == 0)
        return 1;

    p0 = (xmlTextWriterStackEntry *) data0;
    p1 = (xmlTextWriterStackEntry *) data1;

    return xmlStrcmp(p0->name, p1->name);
}